

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

void ggml_backend_sched_reset(ggml_backend_sched_t sched)

{
  if (sched->is_reset == false) {
    ggml_hash_set_reset(&sched->hash_set);
    memset(sched->hv_tensor_backend_ids,0xff,(sched->hash_set).size << 2);
    memset(sched->hv_tensor_copies,0,
           (long)sched->n_backends * (sched->hash_set).size * (long)sched->n_copies * 8);
    sched->is_reset = true;
  }
  sched->is_alloc = false;
  return;
}

Assistant:

void ggml_backend_sched_reset(ggml_backend_sched_t sched) {
    // reset state for the next run
    if (!sched->is_reset) {
        ggml_hash_set_reset(&sched->hash_set);
        memset(sched->hv_tensor_backend_ids, -1, sched->hash_set.size * sizeof(sched->hv_tensor_backend_ids[0]));
        memset(sched->hv_tensor_copies,       0, sched->hash_set.size * sched->n_backends * sched->n_copies * sizeof(struct ggml_tensor *));
        sched->is_reset = true;
    }
    sched->is_alloc = false;
}